

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectwriter.cc
# Opt level: O2

void __thiscall
google::protobuf::util::converter::ProtoStreamObjectWriter::AnyWriter::RenderDataPiece
          (AnyWriter *this,StringPiece name,DataPiece *value)

{
  bool bVar1;
  ProtoStreamObjectWriter *pPVar2;
  StringPiece value_00;
  StringPiece local_120;
  undefined1 local_110 [8];
  Status status;
  StringPiece local_a0;
  StringPiece local_90;
  StringPiece local_80;
  StringPiece local_70;
  StringPiece local_60;
  StringPiece local_50;
  StringPiece local_40;
  
  pPVar2 = (this->ow_)._M_t.
           super___uniq_ptr_impl<google::protobuf::util::converter::ProtoStreamObjectWriter,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter_*,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter>_>
           .
           super__Head_base<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter_*,_false>
           ._M_head_impl;
  if (pPVar2 == (ProtoStreamObjectWriter *)0x0 && this->depth_ == 0) {
    StringPiece::StringPiece(&local_120,"@type");
    bVar1 = operator==(name,local_120);
    if (bVar1) {
      StartAny(this,value);
      return;
    }
    pPVar2 = (this->ow_)._M_t.
             super___uniq_ptr_impl<google::protobuf::util::converter::ProtoStreamObjectWriter,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter_*,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter>_>
             .
             super__Head_base<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter_*,_false>
             ._M_head_impl;
  }
  if (pPVar2 == (ProtoStreamObjectWriter *)0x0) {
    Event::Event((Event *)local_110,name,value);
    std::
    vector<google::protobuf::util::converter::ProtoStreamObjectWriter::AnyWriter::Event,_std::allocator<google::protobuf::util::converter::ProtoStreamObjectWriter::AnyWriter::Event>_>
    ::emplace_back<google::protobuf::util::converter::ProtoStreamObjectWriter::AnyWriter::Event>
              (&this->uninterpreted_events_,(Event *)local_110);
    Event::~Event((Event *)local_110);
  }
  else if ((this->depth_ == 0) && (this->is_well_known_type_ == true)) {
    StringPiece::StringPiece(&local_a0,"value");
    bVar1 = operator!=(name,local_a0);
    if ((bVar1) && (this->invalid_ == false)) {
      pPVar2 = this->parent_;
      StringPiece::StringPiece(&local_90,"Any");
      StringPiece::StringPiece(&local_80,"Expect a \"value\" field for well-known types.");
      ProtoWriter::InvalidValue(&pPVar2->super_ProtoWriter,local_90,local_80);
      this->invalid_ = true;
    }
    if (this->well_known_type_render_ == (TypeRenderer *)0x0) {
      if ((value->type_ != TYPE_NULL) && (this->invalid_ == false)) {
        pPVar2 = this->parent_;
        StringPiece::StringPiece(&local_70,"Any");
        StringPiece::StringPiece(&local_60,"Expect a JSON object.");
        ProtoWriter::InvalidValue(&pPVar2->super_ProtoWriter,local_70,local_60);
        this->invalid_ = true;
      }
    }
    else {
      pPVar2 = (this->ow_)._M_t.
               super___uniq_ptr_impl<google::protobuf::util::converter::ProtoStreamObjectWriter,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter_*,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter>_>
               .
               super__Head_base<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter_*,_false>
               ._M_head_impl;
      StringPiece::StringPiece(&local_50,"");
      ProtoWriter::StartObject(&pPVar2->super_ProtoWriter,local_50);
      (**this->well_known_type_render_)
                ((Status *)local_110,
                 (this->ow_)._M_t.
                 super___uniq_ptr_impl<google::protobuf::util::converter::ProtoStreamObjectWriter,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter_*,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter>_>
                 .
                 super__Head_base<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter_*,_false>
                 ._M_head_impl,value);
      if (local_110._0_4_ != START_OBJECT) {
        pPVar2 = (this->ow_)._M_t.
                 super___uniq_ptr_impl<google::protobuf::util::converter::ProtoStreamObjectWriter,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter_*,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter>_>
                 .
                 super__Head_base<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter_*,_false>
                 ._M_head_impl;
        StringPiece::StringPiece(&local_40,"Any");
        value_00 = Status::message((Status *)local_110);
        ProtoWriter::InvalidValue(&pPVar2->super_ProtoWriter,local_40,value_00);
      }
      ProtoWriter::EndObject
                (&((this->ow_)._M_t.
                   super___uniq_ptr_impl<google::protobuf::util::converter::ProtoStreamObjectWriter,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter_*,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter>_>
                   .
                   super__Head_base<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter_*,_false>
                  ._M_head_impl)->super_ProtoWriter);
      std::__cxx11::string::~string((string *)&status);
    }
  }
  else {
    (**(code **)(*(long *)&(pPVar2->super_ProtoWriter).super_StructuredObjectWriter.
                           super_ObjectWriter + 0x90))(pPVar2,name.ptr_,name.length_,value);
  }
  return;
}

Assistant:

void ProtoStreamObjectWriter::AnyWriter::RenderDataPiece(
    StringPiece name, const DataPiece& value) {
  // Start an Any only at depth_ 0. Other RenderDataPiece calls with "@type"
  // should go to the contained ow_ as they indicate nested Anys.
  if (depth_ == 0 && ow_ == nullptr && name == "@type") {
    StartAny(value);
  } else if (ow_ == nullptr) {
    // Save data before the "@type" field.
    uninterpreted_events_.push_back(Event(name, value));
  } else if (depth_ == 0 && is_well_known_type_) {
    if (name != "value" && !invalid_) {
      parent_->InvalidValue("Any",
                            "Expect a \"value\" field for well-known types.");
      invalid_ = true;
    }
    if (well_known_type_render_ == nullptr) {
      // Only Any and Struct don't have a special type render but both of
      // them expect a JSON object (i.e., a StartObject() call).
      if (value.type() != DataPiece::TYPE_NULL && !invalid_) {
        parent_->InvalidValue("Any", "Expect a JSON object.");
        invalid_ = true;
      }
    } else {
      ow_->ProtoWriter::StartObject("");
      Status status = (*well_known_type_render_)(ow_.get(), value);
      if (!status.ok()) ow_->InvalidValue("Any", status.message());
      ow_->ProtoWriter::EndObject();
    }
  } else {
    ow_->RenderDataPiece(name, value);
  }
}